

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

int get_down2_steps(int in_length,int out_length)

{
  int in_ESI;
  int in_EDI;
  int proj_in_length;
  int steps;
  int local_c;
  int local_4;
  
  local_c = 0;
  local_4 = in_EDI;
  do {
    local_4 = get_down2_length(local_4,1);
    if (local_4 < in_ESI) {
      return local_c;
    }
    local_c = local_c + 1;
  } while (local_4 != 1);
  return local_c;
}

Assistant:

static int get_down2_steps(int in_length, int out_length) {
  int steps = 0;
  int proj_in_length;
  while ((proj_in_length = get_down2_length(in_length, 1)) >= out_length) {
    ++steps;
    in_length = proj_in_length;
    if (in_length == 1) {
      // Special case: we break because any further calls to get_down2_length()
      // with be with length == 1, which return 1, resulting in an infinite
      // loop.
      break;
    }
  }
  return steps;
}